

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

bool appendToFile(string *filePath,string *text)

{
  uint uVar1;
  long local_220;
  ofstream file;
  uint auStack_200 [120];
  
  std::ofstream::ofstream((string *)&local_220);
  std::ofstream::open((string *)&local_220,(_Ios_Openmode)filePath);
  uVar1 = *(uint *)((long)auStack_200 + *(long *)(local_220 + -0x18));
  if ((uVar1 & 5) == 0) {
    std::operator<<((ostream *)&local_220,(string *)text);
    std::ofstream::close();
  }
  std::ofstream::~ofstream(&local_220);
  return (uVar1 & 5) == 0;
}

Assistant:

bool appendToFile(const std::string filePath, const std::string text)
{
    std::ofstream file;
    file.open(filePath, std::ios::out | std::ios::app);
    if (file.fail())
        return false;

    file << text;
    file.close();
    return true;
}